

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O1

t_int * tabplay_tilde_perform(t_int *w)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t __n;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  void *__s;
  uint uVar10;
  
  lVar2 = w[1];
  __s = (void *)w[2];
  iVar1 = *(int *)(lVar2 + 0x38);
  iVar4 = *(int *)(lVar2 + 0x40);
  if (*(int *)(lVar2 + 0x3c) < *(int *)(lVar2 + 0x40)) {
    iVar4 = *(int *)(lVar2 + 0x3c);
  }
  lVar3 = *(long *)(lVar2 + 0x48);
  uVar10 = (uint)w[3];
  if (lVar3 == 0 || iVar4 <= iVar1) {
    if (uVar10 == 0) goto LAB_00118880;
    __n = (w[3] & 0xffffffffU) << 2;
  }
  else {
    uVar5 = iVar4 - iVar1;
    uVar9 = uVar10;
    if ((int)uVar5 < (int)uVar10) {
      uVar9 = uVar5;
    }
    if (uVar9 != 0) {
      uVar6 = uVar10;
      if ((int)uVar5 < (int)uVar10) {
        uVar6 = uVar5;
      }
      lVar7 = 0;
      lVar8 = 0;
      do {
        *(undefined4 *)((long)__s + lVar8 * 4) =
             *(undefined4 *)(lVar3 + (long)iVar1 * 8 + lVar8 * 8);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + -4;
      } while (uVar6 != (uint)lVar8);
      __s = (void *)((long)__s - lVar7);
    }
    if ((int)(iVar1 + uVar9) < iVar4) {
      *(uint *)(lVar2 + 0x38) = iVar1 + uVar9;
      goto LAB_00118880;
    }
    clock_delay(*(_clock **)(lVar2 + 0x58),0.0);
    *(undefined4 *)(lVar2 + 0x38) = 0x7fffffff;
    if ((int)uVar10 <= (int)uVar5) goto LAB_00118880;
    __n = (ulong)(~uVar9 + uVar10) * 4 + 4;
  }
  memset(__s,0,__n);
LAB_00118880:
  return w + 4;
}

Assistant:

static t_int *tabplay_tilde_perform(t_int *w)
{
    t_tabplay_tilde *x = (t_tabplay_tilde *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_word *wp;
    int n = (int)(w[3]), phase = x->x_phase,
        endphase = (x->x_nsampsintab < x->x_limit ?
            x->x_nsampsintab : x->x_limit), nxfer, n3;
    if (!x->x_vec || phase >= endphase)
        goto zero;

    nxfer = endphase - phase;
    wp = x->x_vec + phase;
    if (nxfer > n)
        nxfer = n;
    n3 = n - nxfer;
    phase += nxfer;
    while (nxfer--)
        *out++ = (wp++)->w_float;
    if (phase >= endphase)
    {
        clock_delay(x->x_clock, 0);
        x->x_phase = 0x7fffffff;
        while (n3--)
            *out++ = 0;
    }
    else x->x_phase = phase;

    return (w+4);
zero:
    while (n--) *out++ = 0;
    return (w+4);
}